

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O1

int do_command(int command,int repcount,boolean firsttime,nh_cmd_arg *arg)

{
  uint uVar1;
  int iVar2;
  nh_cmd_arg *pnVar3;
  obj *poVar4;
  schar sVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  obj *poVar9;
  schar sVar10;
  uint uVar11;
  schar sVar12;
  nh_cmd_arg noarg;
  nh_cmd_arg local_38;
  
  local_38.argtype = 2;
  local_38.field_1 = (anon_union_4_3_6c6a2010_for_nh_cmd_arg_1)0x0;
  if (command == -1) {
    arg = &prev_arg;
    command = prev_command;
    repcount = prev_repcount;
  }
  pnVar3 = arg;
  if (arg == (nh_cmd_arg *)0x0) {
    pnVar3 = &local_38;
  }
  prev_arg = *pnVar3;
  flags.move = '\0';
  multi = 0;
  prev_command = command;
  prev_repcount = repcount;
  if (firsttime != '\0') {
    u.last_str_turn = 0;
    flags.nopick = '\0';
    check_tutorial_command(command,pnVar3);
  }
  uVar1 = cmdlist[command].flags;
  uVar11 = pnVar3->argtype & uVar1;
  if (uVar11 == 0) {
    return 2;
  }
  if (((u._1052_1_ & 0x20) == 0) || (cmdlist[command].can_if_buried != '\0')) {
    uVar7 = (uVar1 & 0x1c) - 2 >> 1;
    if ((uVar1 & 0x1c) == 0) {
      uVar7 = 0;
    }
    iVar6 = 2;
    multi = repcount;
    switch(uVar7) {
    case 0:
      if ((1 < repcount && occupation == (_func_int *)0x0) && cmdlist[command].text != (char *)0x0)
      {
        occupation = timed_occupation;
        occtime = 0;
        timed_occ_fn = (_func_int *)cmdlist[command].func;
        occtxt = cmdlist[command].text;
      }
      flags.move = '\x01';
      iVar2 = (*(code *)cmdlist[command].func)();
      break;
    case 1:
      if (firsttime == '\0') {
        sVar10 = '\0';
        sVar12 = u.dx;
        sVar5 = u.dy;
      }
      else {
        sVar12 = -2;
        sVar5 = -2;
        sVar10 = -2;
        if (uVar11 == 4) {
          pnVar3 = &local_38;
          if (arg != (nh_cmd_arg *)0x0) {
            pnVar3 = arg;
          }
          lVar8 = (long)(pnVar3->field_1).d;
          if (lVar8 != -1) {
            sVar12 = xdir[lVar8];
            sVar5 = ""[lVar8];
            sVar10 = ""[lVar8];
          }
          if ((pnVar3->field_1).d == DIR_NONE) {
            return 2;
          }
          if (((sVar12 != '\0') && (sVar5 != '\0')) && (u.umonnum == 0x78)) {
            return 2;
          }
        }
      }
      flags.move = '\x01';
      if (firsttime != '\0') {
        u.dx = sVar12;
        u.dy = sVar5;
      }
      iVar2 = (*(code *)cmdlist[command].func)((int)sVar12,(int)sVar5,(int)sVar10);
      break;
    default:
      goto switchD_0015c8c0_caseD_2;
    case 3:
      iVar6 = -1;
      iVar2 = -1;
      if (uVar11 == 8) {
        pnVar3 = &local_38;
        if (arg != (nh_cmd_arg *)0x0) {
          pnVar3 = arg;
        }
        iVar2 = (int)(pnVar3->field_1).pos.x;
        iVar6 = (int)(pnVar3->field_1).pos.y;
      }
      flags.move = '\x01';
      iVar2 = (*(code *)cmdlist[command].func)(iVar2,iVar6);
      break;
    case 7:
      if (uVar11 == 0x10) {
        if ((short)uVar1 < 0) {
          pnVar3 = arg;
          if (arg == (nh_cmd_arg *)0x0) {
            pnVar3 = &local_38;
          }
          if ((pnVar3->field_1).invlet != '-') goto LAB_0015ca83;
          poVar9 = &zeroobj;
        }
        else {
LAB_0015ca83:
          poVar9 = (obj *)0x0;
        }
        if ((invent != (obj *)0x0) && (poVar9 == (obj *)0x0)) {
          pnVar3 = &local_38;
          if (arg != (nh_cmd_arg *)0x0) {
            pnVar3 = arg;
          }
          poVar4 = invent;
          do {
            if (poVar4->invlet == (pnVar3->field_1).invlet) {
              poVar9 = poVar4;
            }
            poVar4 = poVar4->nobj;
          } while ((poVar4 != (obj *)0x0) && (poVar9 == (obj *)0x0));
        }
      }
      else {
        poVar9 = (obj *)0x0;
      }
      flags.move = '\x01';
      iVar2 = (*(code *)cmdlist[command].func)(poVar9);
    }
    if (0 < multi) {
      multi = multi + -1;
    }
  }
  else {
    iVar2 = 0;
    pline("You can\'t do that while you are buried!");
  }
  iVar6 = 3;
  if (iVar2 == 0) {
    flags.move = '\0';
    iVar6 = 3;
switchD_0015c8c0_caseD_2:
    multi = 0;
  }
  return iVar6;
}

Assistant:

int do_command(int command, int repcount, boolean firsttime, struct nh_cmd_arg *arg)
{
	schar dx, dy, dz;
	int x, y;
	int res, (*func)(void), (*func_dir)(int, int, int), (*func_pos)(int,int);
	int (*func_obj)(struct obj*);
	struct obj *obj, *otmp;
	struct nh_cmd_arg noarg = {CMD_ARG_NONE};
	int argtype, functype;
	boolean allow_zeroobj;
	
	/* for multi-turn movement, we use re-invocation of do_command rather
	 * than set_occupation, so the relevant command must be saved and restored */
	if (command == -1) {
	    command = prev_command;
	    arg = &prev_arg;
	    repcount = prev_repcount;
	}
	
	/* NULL arg is synonymous to CMD_ARG_NONE */
	if (!arg)
	    arg = &noarg;
	
	prev_command = command;
	prev_arg = *arg;
	prev_repcount = repcount;
	
	flags.move = FALSE;
	multi = 0;
	
	if (firsttime) {
	    u.last_str_turn = 0; /* for flags.run > 1 movement */
	    flags.nopick = 0;
	}
	
	if (command == -1)
	    return COMMAND_UNKNOWN;
	
	/* Collect commands to show suitable ambient tutorial messages. */
	if (firsttime)
	    check_tutorial_command(command, arg);
	
	/* in some cases, a command function will accept either it's proper argument
	 * type or no argument; we're looking for the possible type of the argument here */
	functype = (cmdlist[command].flags & CMD_ARG_FLAGS);
	if (!functype)
	    functype = CMD_ARG_NONE;
	allow_zeroobj = (cmdlist[command].flags & CMD_ZEROOBJ) ? TRUE : FALSE;

	argtype = (arg->argtype & cmdlist[command].flags);
	if (!argtype)
	    return COMMAND_BAD_ARG;
	
	if (u.uburied && !cmdlist[command].can_if_buried) {
	    pline("You can't do that while you are buried!");
	    res = 0;
	} else {
	    multi = repcount;
	    
	    switch (functype) {
		case CMD_ARG_NONE:
		    func = cmdlist[command].func;
		    if (cmdlist[command].text && !occupation && multi > 1)
			set_occupation(func, cmdlist[command].text, multi - 1);
		    flags.move = TRUE;
		    res = (*func)();		/* perform the command */
		    break;
		
		case CMD_ARG_DIR:
		    func_dir = cmdlist[command].func;
		    if (!firsttime) {
			/* for multi-move commands such as dogo ('g') and
			 * dogo2 ('G'), the last-used direction is kept in u.dx
			 * and u.dy. lookaround() may change these values! */
			dx = u.dx;
			dy = u.dy;
			dz = 0;
		    }
		    else if (argtype == CMD_ARG_DIR) {
			if (!dir_to_delta(arg->d, &dx, &dy, &dz))
			    return COMMAND_BAD_ARG;
			if (dx && dy && u.umonnum == PM_GRID_BUG)
			    return COMMAND_BAD_ARG;
			
		    } else {
			 /* invalid direction deltas indicate that no arg was given */
			dx = -2; dy = -2; dz = -2;
		    }
		    flags.move = TRUE;
		    if (firsttime) {
			u.dx = dx;
			u.dy = dy;
		    }
		    res = func_dir(dx, dy, dz);
		    break;
		
		case CMD_ARG_POS:
		    func_pos = cmdlist[command].func;
		    if (argtype == CMD_ARG_POS) {
			x = arg->pos.x;
			y = arg->pos.y;
		    } else {
			x = -1;
			y = -1;
		    }
		    flags.move = TRUE;
		    res = func_pos(x, y);
		    break;
		
		case CMD_ARG_OBJ:
		    func_obj = cmdlist[command].func;
		    obj = NULL;
		    if (argtype == CMD_ARG_OBJ) {
			if (allow_zeroobj && arg->invlet == '-')
			    obj = &zeroobj;
			for (otmp = invent; otmp && !obj; otmp = otmp->nobj)
			    if (otmp->invlet == arg->invlet)
				obj = otmp;
		    }
		    flags.move = TRUE;
		    res = func_obj(obj);
		    break;
		    
		default:
		    multi = 0;
		    return COMMAND_BAD_ARG;
	    }
	    
	    if (multi > 0)
		--multi;
	}
	
	if (!res) {
	    flags.move = FALSE;
	    multi = 0;
	}
	
	return COMMAND_OK;
}